

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

int __thiscall
DnsStats::SubmitQuery
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start,bool is_response,
          int *qclass,int *qtype)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint uVar5;
  uint32_t name_start;
  int rrtype;
  int rrclass;
  int *qclass_local;
  uint32_t local_20;
  bool is_response_local;
  uint32_t start_local;
  uint32_t length_local;
  uint8_t *packet_local;
  DnsStats *this_local;
  
  uVar5 = SubmitName(this,packet,length,start,false);
  if (length < uVar5 + 4) {
    this->error_flags = this->error_flags | 0x100;
    local_20 = length;
  }
  else {
    uVar1 = packet[uVar5];
    uVar2 = packet[uVar5 + 1];
    uVar3 = packet[uVar5 + 2];
    uVar4 = packet[uVar5 + 3];
    local_20 = uVar5 + 4;
    *qclass = (uint)CONCAT11(uVar3,uVar4);
    *qtype = (uint)CONCAT11(uVar1,uVar2);
    SubmitQueryContent(this,(uint)CONCAT11(uVar1,uVar2),(uint)CONCAT11(uVar3,uVar4),packet,length,
                       start);
  }
  return local_20;
}

Assistant:

int DnsStats::SubmitQuery(uint8_t * packet, uint32_t length, uint32_t start, bool is_response, int * qclass, int * qtype)
{
    int rrclass = 0;
    int rrtype = 0;
    uint32_t name_start = start;

    /* TODO: if we decide to tabulate parameters in queries, will need
     * to check "is_response" value and controlling flag */
    UNREFERENCED_PARAMETER(is_response);

    start = SubmitName(packet, length, start, false);

    if (start + 4 <= length)
    {
        rrtype = (packet[start] << 8) | packet[start + 1];
        rrclass = (packet[start + 2] << 8) | packet[start + 3];
        start += 4;
        *qclass = rrclass;
        *qtype = rrtype;

        SubmitQueryContent(rrtype, rrclass, packet, length, name_start);
    }
    else
    {
        error_flags |= DNS_REGISTRY_ERROR_FORMAT;
        start = length;
    }

    return start;
}